

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O2

uint16_t __thiscall
xray_re::xr_ogf_v3::motion_io::import_params_new(motion_io *this,xr_reader *r,uint version)

{
  uint16_t uVar1;
  uint32_t *puVar2;
  uint16_t *puVar3;
  float *pfVar4;
  
  xr_reader::r_sz(r,&(this->super_xr_skl_motion).super_xr_motion.m_name);
  puVar2 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  (this->super_xr_skl_motion).m_flags = *puVar2;
  puVar3 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
  (this->super_xr_skl_motion).m_bone_or_part = *puVar3;
  puVar3 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
  uVar1 = *puVar3;
  (r->field_2).m_p = (uint8_t *)(puVar3 + 3);
  (this->super_xr_skl_motion).m_speed = *(float *)(puVar3 + 1);
  pfVar4 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
  (this->super_xr_skl_motion).m_power = *pfVar4;
  pfVar4 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
  (this->super_xr_skl_motion).m_accrue = *pfVar4;
  pfVar4 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar4 + 1);
  (this->super_xr_skl_motion).m_falloff = *pfVar4;
  return uVar1;
}

Assistant:

inline uint16_t xr_ogf_v3::motion_io::import_params_new(xr_reader& r, unsigned version)
{
	r.r_sz(m_name);
	m_flags = r.r_u32();
	m_bone_or_part = r.r_u16();
	uint16_t motion_id = r.r_u16();
	m_speed = r.r_float();
	m_power = r.r_float();
	m_accrue = r.r_float();
	m_falloff = r.r_float();

	return motion_id;
}